

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapelinear.cpp
# Opt level: O0

void pzshape::TPZShapeLinear::Expo(REAL x,int num,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  long *plVar1;
  double dVar2;
  long col;
  double *pdVar3;
  long lVar4;
  TPZFMatrix<double> *in_RDX;
  long *in_RSI;
  int in_EDI;
  double in_XMM0_Qa;
  int ord;
  double in_stack_ffffffffffffff98;
  TPZFMatrix<double> *in_stack_ffffffffffffffa0;
  double local_48;
  int local_3c;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  TPZFMatrix<double> *local_20;
  long *local_18;
  int local_c;
  double local_8;
  
  if (0 < in_EDI) {
    local_28 = 0x3ff0000000000000;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_c = in_EDI;
    local_8 = in_XMM0_Qa;
    (**(code **)(*in_RSI + 0x100))(in_RSI,0,0,&local_28);
    local_30 = 0;
    (*(local_20->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0x20])(local_20,0,0,&local_30);
    if (local_c != 1) {
      (**(code **)(*local_18 + 0x100))(local_18,1,0,&local_8);
      local_38 = 0x3ff0000000000000;
      (*(local_20->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0x20])(local_20,0,1,&local_38);
      for (local_3c = 2; dVar2 = local_8, plVar1 = local_18, local_3c < local_c;
          local_3c = local_3c + 1) {
        col = (long)local_3c;
        pdVar3 = TPZFMatrix<double>::operator()
                           (in_stack_ffffffffffffffa0,(int64_t)in_stack_ffffffffffffff98,col);
        local_48 = dVar2 * *pdVar3;
        (**(code **)(*plVar1 + 0x100))(plVar1,col,0,&local_48);
        lVar4 = (long)local_3c;
        in_stack_ffffffffffffff98 = (double)local_3c;
        in_stack_ffffffffffffffa0 = local_20;
        TPZFMatrix<double>::operator()(local_20,(int64_t)in_stack_ffffffffffffff98,col);
        (*(in_stack_ffffffffffffffa0->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable[0x20])(in_stack_ffffffffffffffa0,0,lVar4);
      }
    }
  }
  return;
}

Assistant:

void TPZShapeLinear::Expo(REAL x,int num,TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi){
        // Quadratic or higher shape functions
        if(num <= 0) return;
        phi.Put(0,0,1.0);
        dphi.Put(0,0, 0.0);
        if(num == 1) return;
        phi.Put(1,0, x);
        dphi.Put(0,1, 1.0);
        int ord;
        for(ord = 2;ord<num;ord++) {
            phi.Put(ord,0, x*phi(ord-1,0));
            dphi.Put(0,ord, ord*phi(ord-1,0));
        }
    }